

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall IteratorTest::arithmeticOperatorsTest<true>(IteratorTest *this)

{
  pointer puVar1;
  pointer puVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar4;
  runtime_error *prVar5;
  logic_error *plVar6;
  code *pcVar7;
  int iVar8;
  ulong uVar9;
  undefined *puVar10;
  long lVar11;
  Iterator<int,_true,_std::allocator<unsigned_long>_> it;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_228;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_1f8;
  undefined1 local_1c8 [16];
  size_t *local_1b8;
  size_t local_1a0;
  size_t local_198;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_188;
  view_pointer local_158;
  int *piStack_150;
  ulong local_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_140;
  view_pointer local_128;
  int *piStack_120;
  ulong local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_110;
  view_pointer local_f8;
  int *piStack_f0;
  ulong local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  view_pointer local_c8;
  int *piStack_c0;
  ulong local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  view_pointer local_98;
  int *piStack_90;
  ulong local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  view_pointer local_68;
  int *piStack_60;
  ulong local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  
  _Var3._M_current = (unsigned_long *)operator_new(8);
  *_Var3._M_current = 0x18;
  local_1c8._0_8_ = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1c8 + 8),_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_228);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
  local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.index_ = 0;
  local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.view_ = (view_pointer)0x0;
  local_228.pointer_ = (pointer)0x0;
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_228);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_1f8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8,0);
  puVar2 = local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar1 = local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_228.view_ = local_1f8.view_;
  local_228.pointer_ = local_1f8.pointer_;
  local_228.index_ = local_1f8.index_;
  local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
  }
  if (local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar11 = 0;
  do {
    if ((local_228.view_ == (view_pointer)0x0) ||
       (((local_228.view_)->geometry_).size_ <= local_228.index_)) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
      pcVar7 = std::runtime_error::~runtime_error;
      puVar10 = &std::runtime_error::typeinfo;
LAB_001c5817:
      __cxa_throw(plVar6,puVar10,pcVar7);
    }
    if (*local_228.pointer_ != this->data_[lVar11]) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar6,"test failed.");
      pcVar7 = std::logic_error::~logic_error;
      puVar10 = &std::logic_error::typeinfo;
      goto LAB_001c5817;
    }
    local_1f8.view_ = (view_pointer)0x1;
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator+=
              (&local_228,(difference_type *)&local_1f8);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x18);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_1f8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8,local_198);
  if (local_228.view_ == (view_pointer)0x0) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
  }
  else {
    if (local_1f8.view_ == local_228.view_) {
      if (local_228.index_ == local_1f8.index_) {
        if (local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pIVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--(&local_228)
        ;
        if ((pIVar4->view_ == (view_pointer)0x0) ||
           ((pIVar4->view_->geometry_).size_ <= pIVar4->index_)) {
          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
          pcVar7 = std::runtime_error::~runtime_error;
          puVar10 = &std::runtime_error::typeinfo;
LAB_001c5ffb:
          __cxa_throw(plVar6,puVar10,pcVar7);
        }
        if (*pIVar4->pointer_ != 0x2e) {
          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar6,"test failed.");
          pcVar7 = std::logic_error::~logic_error;
          puVar10 = &std::logic_error::typeinfo;
          goto LAB_001c5ffb;
        }
        if (local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_228.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_228.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        operator_delete(local_1b8,local_1a0 * 0x18);
        operator_delete(_Var3._M_current,8);
        _Var3._M_current = (unsigned_long *)operator_new(8);
        *_Var3._M_current = 0x18;
        local_1c8._0_8_ = this;
        andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
        Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((Geometry<std::allocator<unsigned_long>> *)(local_1c8 + 8),_Var3,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                   (allocator_type *)&local_228);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
        local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_228.index_ = 0;
        local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_228.view_ = (view_pointer)0x0;
        local_228.pointer_ = (pointer)0x0;
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_228);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                  (&local_1f8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8,0);
        puVar2 = local_228.coordinates_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        puVar1 = local_228.coordinates_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_228.view_ = local_1f8.view_;
        local_228.pointer_ = local_1f8.pointer_;
        local_228.index_ = local_1f8.index_;
        local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_1f8.coordinates_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_1f8.coordinates_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_228.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1f8.coordinates_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar1 != (pointer)0x0) {
          operator_delete(puVar1,(long)puVar2 - (long)puVar1);
        }
        if (local_1f8.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        lVar11 = 0;
        do {
          if ((local_228.view_ == (view_pointer)0x0) ||
             (((local_228.view_)->geometry_).size_ <= local_228.index_)) {
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
            pcVar7 = std::runtime_error::~runtime_error;
            puVar10 = &std::runtime_error::typeinfo;
LAB_001c5849:
            __cxa_throw(plVar6,puVar10,pcVar7);
          }
          if (*local_228.pointer_ != this->data_[lVar11]) {
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar6,"test failed.");
            pcVar7 = std::logic_error::~logic_error;
            puVar10 = &std::logic_error::typeinfo;
            goto LAB_001c5849;
          }
          local_1f8.view_ = (view_pointer)0x1;
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator+=
                    (&local_228,(difference_type *)&local_1f8);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x18);
        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                  (&local_1f8,(View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8,local_198
                  );
        if (local_228.view_ == (view_pointer)0x0) {
          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
        }
        else {
          if (local_1f8.view_ == local_228.view_) {
            if (local_228.index_ == local_1f8.index_) {
              if (local_1f8.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1f8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              pIVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                                 (&local_228);
              if ((pIVar4->view_ == (view_pointer)0x0) ||
                 ((pIVar4->view_->geometry_).size_ <= pIVar4->index_)) {
                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                pcVar7 = std::runtime_error::~runtime_error;
                puVar10 = &std::runtime_error::typeinfo;
LAB_001c60a9:
                __cxa_throw(plVar6,puVar10,pcVar7);
              }
              if (*pIVar4->pointer_ != 0x2e) {
                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar6,"test failed.");
                pcVar7 = std::logic_error::~logic_error;
                puVar10 = &std::logic_error::typeinfo;
                goto LAB_001c60a9;
              }
              if (local_228.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_228.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_228.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_228.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete(local_1b8,local_1a0 * 0x18);
              operator_delete(_Var3._M_current,8);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              local_1c8._0_8_ = this;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_1c8 + 8),_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)&local_228);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
              local_228.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_228.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_228.index_ = 0;
              local_228.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_228.view_ = (view_pointer)0x0;
              local_228.pointer_ = (pointer)0x0;
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_228)
              ;
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                        (&local_188,(View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,0)
              ;
              local_1f8.view_ = (view_pointer)local_188.view_;
              local_1f8.pointer_ = local_188.pointer_;
              local_1f8.index_ = local_188.index_;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_1f8.coordinates_,&local_188.coordinates_);
              andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_1f8)
              ;
              puVar2 = local_228.coordinates_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              puVar1 = local_228.coordinates_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_228.view_ = local_1f8.view_;
              local_228.pointer_ = local_1f8.pointer_;
              local_228.index_ = local_1f8.index_;
              local_228.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_1f8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_228.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1f8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_228.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_1f8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_1f8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_1f8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_1f8.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (puVar1 != (pointer)0x0) {
                operator_delete(puVar1,(long)puVar2 - (long)puVar1);
              }
              if (local_1f8.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1f8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_188.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_188.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_188.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              lVar11 = 0;
              do {
                if ((local_228.view_ == (view_pointer)0x0) ||
                   (((local_228.view_)->geometry_).size_ <= local_228.index_)) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                  pcVar7 = std::runtime_error::~runtime_error;
                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c587b:
                  __cxa_throw(plVar6,puVar10,pcVar7);
                }
                if (*local_228.pointer_ != this->data_[lVar11]) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar6,"test failed.");
                  pcVar7 = std::logic_error::~logic_error;
                  puVar10 = &std::logic_error::typeinfo;
                  goto LAB_001c587b;
                }
                local_1f8.view_ = (view_pointer)0x1;
                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator+=
                          (&local_228,(difference_type *)&local_1f8);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 0x18);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8);
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_1f8,
                         (View<int,_false,_std::allocator<unsigned_long>_> *)local_1c8,local_198);
              if (local_228.view_ == (view_pointer)0x0) {
                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
              }
              else {
                if (local_1f8.view_ == local_228.view_) {
                  if (local_228.index_ == local_1f8.index_) {
                    if (local_1f8.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_1f8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_1f8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    pIVar4 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                                       (&local_228);
                    if ((pIVar4->view_ == (view_pointer)0x0) ||
                       ((pIVar4->view_->geometry_).size_ <= pIVar4->index_)) {
                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.")
                      ;
                      pcVar7 = std::runtime_error::~runtime_error;
                      puVar10 = &std::runtime_error::typeinfo;
LAB_001c6157:
                      __cxa_throw(plVar6,puVar10,pcVar7);
                    }
                    if (*pIVar4->pointer_ != 0x2e) {
                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar6,"test failed.");
                      pcVar7 = std::logic_error::~logic_error;
                      puVar10 = &std::logic_error::typeinfo;
                      goto LAB_001c6157;
                    }
                    if (local_228.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_228.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_228.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_228.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    operator_delete(local_1b8,local_1a0 * 0x18);
                    operator_delete(_Var3._M_current,8);
                    _Var3._M_current = (unsigned_long *)operator_new(8);
                    *_Var3._M_current = 0x18;
                    local_1c8._0_8_ = this;
                    andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                    Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                              ((Geometry<std::allocator<unsigned_long>> *)(local_1c8 + 8),_Var3,
                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                               (allocator_type *)&local_228);
                    andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
                    local_228.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_228.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_228.index_ = 0;
                    local_228.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    local_228.view_ = (view_pointer)0x0;
                    local_228.pointer_ = (pointer)0x0;
                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                              (&local_228);
                    andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                              (&local_1f8,
                               (View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8,
                               local_198);
                    puVar2 = local_228.coordinates_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
                    puVar1 = local_228.coordinates_.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    local_228.view_ = local_1f8.view_;
                    local_228.pointer_ = local_1f8.pointer_;
                    local_228.index_ = local_1f8.index_;
                    local_228.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         local_1f8.coordinates_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                    local_228.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_1f8.coordinates_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    local_228.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         local_1f8.coordinates_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                    local_1f8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    local_1f8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_1f8.coordinates_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    if (puVar1 != (pointer)0x0) {
                      operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                    }
                    if (local_1f8.coordinates_.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_1f8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_1f8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    uVar9 = 0x17;
                    do {
                      local_1f8.view_ = (view_pointer)0x1;
                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator-=
                                (&local_228,(difference_type *)&local_1f8);
                      if ((local_228.view_ == (view_pointer)0x0) ||
                         (((local_228.view_)->geometry_).size_ <= local_228.index_)) {
                        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar6,"Assertion failed.");
                        pcVar7 = std::runtime_error::~runtime_error;
                        puVar10 = &std::runtime_error::typeinfo;
LAB_001c58ad:
                        __cxa_throw(plVar6,puVar10,pcVar7);
                      }
                      iVar8 = (int)uVar9;
                      if (*local_228.pointer_ != this->data_[uVar9]) {
                        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar6,"test failed.");
                        pcVar7 = std::logic_error::~logic_error;
                        puVar10 = &std::logic_error::typeinfo;
                        goto LAB_001c58ad;
                      }
                      uVar9 = (ulong)(iVar8 - 1);
                    } while (iVar8 != 0);
                    andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
                    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                              (&local_1f8,
                               (View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8,0);
                    if (local_228.view_ == (view_pointer)0x0) {
                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.")
                      ;
                    }
                    else {
                      if (local_1f8.view_ == local_228.view_) {
                        if (local_228.index_ == local_1f8.index_) {
                          if (local_1f8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_1f8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_1f8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if ((local_228.view_ == (view_pointer)0x0) ||
                             (((local_228.view_)->geometry_).size_ <= local_228.index_)) {
                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar6,"Assertion failed.");
                            pcVar7 = std::runtime_error::~runtime_error;
                            puVar10 = &std::runtime_error::typeinfo;
LAB_001c6205:
                            __cxa_throw(plVar6,puVar10,pcVar7);
                          }
                          if (*local_228.pointer_ != 0) {
                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar6,"test failed.");
                            pcVar7 = std::logic_error::~logic_error;
                            puVar10 = &std::logic_error::typeinfo;
                            goto LAB_001c6205;
                          }
                          if (local_228.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_228.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_228.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          operator_delete(local_1b8,local_1a0 * 0x18);
                          operator_delete(_Var3._M_current,8);
                          _Var3._M_current = (unsigned_long *)operator_new(8);
                          *_Var3._M_current = 0x18;
                          local_1c8._0_8_ = this;
                          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((Geometry<std::allocator<unsigned_long>> *)(local_1c8 + 8),
                                     _Var3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                            )(_Var3._M_current + 1),&andres::defaultOrder,
                                     &andres::defaultOrder,(allocator_type *)&local_228);
                          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
                          local_228.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_228.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          local_228.index_ = 0;
                          local_228.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_228.view_ = (view_pointer)0x0;
                          local_228.pointer_ = (pointer)0x0;
                          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    (&local_228);
                          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
                          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                    (&local_1f8,
                                     (View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8,
                                     local_198);
                          puVar2 = local_228.coordinates_.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          puVar1 = local_228.coordinates_.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          local_228.view_ = local_1f8.view_;
                          local_228.pointer_ = local_1f8.pointer_;
                          local_228.index_ = local_1f8.index_;
                          local_228.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start =
                               local_1f8.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                          local_228.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               local_1f8.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                          local_228.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage =
                               local_1f8.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                          local_1f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start = (pointer)0x0;
                          local_1f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish = (pointer)0x0;
                          local_1f8.coordinates_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          if (puVar1 != (pointer)0x0) {
                            operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                          }
                          if (local_1f8.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_1f8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_1f8.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          uVar9 = 0x17;
                          do {
                            local_1f8.view_ = (view_pointer)0x1;
                            andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator-=
                                      (&local_228,(difference_type *)&local_1f8);
                            if ((local_228.view_ == (view_pointer)0x0) ||
                               (((local_228.view_)->geometry_).size_ <= local_228.index_)) {
                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar6,"Assertion failed.");
                              pcVar7 = std::runtime_error::~runtime_error;
                              puVar10 = &std::runtime_error::typeinfo;
LAB_001c58df:
                              __cxa_throw(plVar6,puVar10,pcVar7);
                            }
                            iVar8 = (int)uVar9;
                            if (*local_228.pointer_ != this->data_[uVar9]) {
                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar6,"test failed.");
                              pcVar7 = std::logic_error::~logic_error;
                              puVar10 = &std::logic_error::typeinfo;
                              goto LAB_001c58df;
                            }
                            uVar9 = (ulong)(iVar8 - 1);
                          } while (iVar8 != 0);
                          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8);
                          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                    (&local_1f8,
                                     (View<int,_true,_std::allocator<unsigned_long>_> *)local_1c8,0)
                          ;
                          if (local_228.view_ == (view_pointer)0x0) {
                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar6,"Assertion failed.");
                          }
                          else {
                            if (local_1f8.view_ == local_228.view_) {
                              if (local_228.index_ == local_1f8.index_) {
                                if (local_1f8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                if ((local_228.view_ == (view_pointer)0x0) ||
                                   (((local_228.view_)->geometry_).size_ <= local_228.index_)) {
                                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar6,"Assertion failed.");
                                  pcVar7 = std::runtime_error::~runtime_error;
                                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c62b3:
                                  __cxa_throw(plVar6,puVar10,pcVar7);
                                }
                                if (*local_228.pointer_ != 0) {
                                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar6,"test failed.");
                                  pcVar7 = std::logic_error::~logic_error;
                                  puVar10 = &std::logic_error::typeinfo;
                                  goto LAB_001c62b3;
                                }
                                if (local_228.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                operator_delete(local_1b8,local_1a0 * 0x18);
                                operator_delete(_Var3._M_current,8);
                                _Var3._M_current = (unsigned_long *)operator_new(8);
                                *_Var3._M_current = 0x18;
                                local_1c8._0_8_ = this;
                                andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                          ((Geometry<std::allocator<unsigned_long>> *)
                                           (local_1c8 + 8),_Var3,
                                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                            )(_Var3._M_current + 1),&andres::defaultOrder,
                                           &andres::defaultOrder,(allocator_type *)&local_228);
                                andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                              local_1c8);
                                local_228.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                local_228.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                local_228.index_ = 0;
                                local_228.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                local_228.view_ = (view_pointer)0x0;
                                local_228.pointer_ = (pointer)0x0;
                                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                testInvariant(&local_228);
                                andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                              local_1c8);
                                andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                Iterator(&local_188,
                                         (View<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_1c8,local_198);
                                local_1f8.view_ = (view_pointer)local_188.view_;
                                local_1f8.pointer_ = local_188.pointer_;
                                local_1f8.index_ = local_188.index_;
                                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                          (&local_1f8.coordinates_,&local_188.coordinates_);
                                andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                testInvariant(&local_1f8);
                                puVar2 = local_228.coordinates_.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                puVar1 = local_228.coordinates_.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                                local_228.view_ = local_1f8.view_;
                                local_228.pointer_ = local_1f8.pointer_;
                                local_228.index_ = local_1f8.index_;
                                local_228.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start =
                                     local_1f8.coordinates_.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                                local_228.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     local_1f8.coordinates_.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                                local_228.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage =
                                     local_1f8.coordinates_.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                local_1f8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                local_1f8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                local_1f8.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                if (puVar1 != (pointer)0x0) {
                                  operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                                }
                                if (local_1f8.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                if (local_188.coordinates_.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_188.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                uVar9 = 0x17;
                                do {
                                  local_1f8.view_ = (view_pointer)0x1;
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  operator-=(&local_228,(difference_type *)&local_1f8);
                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                     (((local_228.view_)->geometry_).size_ <= local_228.index_)) {
                                    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar6,"Assertion failed.");
                                    pcVar7 = std::runtime_error::~runtime_error;
                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c5911:
                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                  }
                                  iVar8 = (int)uVar9;
                                  if (*local_228.pointer_ != this->data_[uVar9]) {
                                    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar6,"test failed.");
                                    pcVar7 = std::logic_error::~logic_error;
                                    puVar10 = &std::logic_error::typeinfo;
                                    goto LAB_001c5911;
                                  }
                                  uVar9 = (ulong)(iVar8 - 1);
                                } while (iVar8 != 0);
                                andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                              local_1c8);
                                andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                Iterator((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                                         &local_1f8,
                                         (View<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_1c8,0);
                                if (local_228.view_ == (view_pointer)0x0) {
                                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar6,"Assertion failed.");
                                }
                                else {
                                  if (local_1f8.view_ == local_228.view_) {
                                    if (local_228.index_ == local_1f8.index_) {
                                      if (local_1f8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                      {
                                        operator_delete(local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      if ((local_228.view_ == (view_pointer)0x0) ||
                                         (((local_228.view_)->geometry_).size_ <= local_228.index_))
                                      {
                                        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar6,"Assertion failed.");
                                        pcVar7 = std::runtime_error::~runtime_error;
                                        puVar10 = &std::runtime_error::typeinfo;
LAB_001c6361:
                                        __cxa_throw(plVar6,puVar10,pcVar7);
                                      }
                                      if (*local_228.pointer_ != 0) {
                                        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::logic_error::logic_error(plVar6,"test failed.");
                                        pcVar7 = std::logic_error::~logic_error;
                                        puVar10 = &std::logic_error::typeinfo;
                                        goto LAB_001c6361;
                                      }
                                      if (local_228.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                      {
                                        operator_delete(local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      operator_delete(local_1b8,local_1a0 * 0x18);
                                      operator_delete(_Var3._M_current,8);
                                      _Var3._M_current = (unsigned_long *)operator_new(8);
                                      *_Var3._M_current = 0x18;
                                      local_1c8._0_8_ = this;
                                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>
                                      ::
                                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                ((Geometry<std::allocator<unsigned_long>> *)
                                                 (local_1c8 + 8),_Var3,
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                 &andres::defaultOrder,(allocator_type *)&local_228)
                                      ;
                                      andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_1c8);
                                      local_228.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                      local_228.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)0x0;
                                      local_228.index_ = 0;
                                      local_228.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                      local_228.view_ = (view_pointer)0x0;
                                      local_228.pointer_ = (pointer)0x0;
                                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant(&local_228);
                                      andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_1c8);
                                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                      Iterator(&local_1f8,
                                               (View<int,_true,_std::allocator<unsigned_long>_> *)
                                               local_1c8,0);
                                      puVar2 = local_228.coordinates_.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                      puVar1 = local_228.coordinates_.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start;
                                      local_228.view_ = local_1f8.view_;
                                      local_228.pointer_ = local_1f8.pointer_;
                                      local_228.index_ = local_1f8.index_;
                                      local_228.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start =
                                           local_1f8.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                      local_228.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish =
                                           local_1f8.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_finish;
                                      local_228.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           local_1f8.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                      local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                      local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                      local_1f8.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)0x0;
                                      if (puVar1 != (pointer)0x0) {
                                        operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                                      }
                                      if (local_1f8.coordinates_.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)
                                      {
                                        operator_delete(local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                      }
                                      lVar11 = 0;
                                      do {
                                        if ((local_228.view_ == (view_pointer)0x0) ||
                                           (((local_228.view_)->geometry_).size_ <= local_228.index_
                                           )) {
                                          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar6,"Assertion failed.");
                                          pcVar7 = std::runtime_error::~runtime_error;
                                          puVar10 = &std::runtime_error::typeinfo;
LAB_001c5943:
                                          __cxa_throw(plVar6,puVar10,pcVar7);
                                        }
                                        if (*local_228.pointer_ != this->data_[lVar11]) {
                                          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::logic_error::logic_error(plVar6,"test failed.");
                                          pcVar7 = std::logic_error::~logic_error;
                                          puVar10 = &std::logic_error::typeinfo;
                                          goto LAB_001c5943;
                                        }
                                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>
                                        ::operator++(&local_228);
                                        lVar11 = lVar11 + 1;
                                      } while (lVar11 != 0x18);
                                      andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_1c8);
                                      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                      Iterator(&local_1f8,
                                               (View<int,_true,_std::allocator<unsigned_long>_> *)
                                               local_1c8,local_198);
                                      if (local_228.view_ == (view_pointer)0x0) {
                                        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar6,"Assertion failed.");
                                      }
                                      else {
                                        if (local_1f8.view_ == local_228.view_) {
                                          if (local_228.index_ == local_1f8.index_) {
                                            if (local_1f8.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_1f8.coordinates_.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            pIVar4 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_228);
                                            if ((pIVar4->view_ == (view_pointer)0x0) ||
                                               ((pIVar4->view_->geometry_).size_ <= pIVar4->index_))
                                            {
                                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::runtime_error::runtime_error
                                                        ((runtime_error *)plVar6,"Assertion failed."
                                                        );
                                              pcVar7 = std::runtime_error::~runtime_error;
                                              puVar10 = &std::runtime_error::typeinfo;
LAB_001c640f:
                                              __cxa_throw(plVar6,puVar10,pcVar7);
                                            }
                                            if (*pIVar4->pointer_ != 0x2e) {
                                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::logic_error::logic_error(plVar6,"test failed.");
                                              pcVar7 = std::logic_error::~logic_error;
                                              puVar10 = &std::logic_error::typeinfo;
                                              goto LAB_001c640f;
                                            }
                                            if (local_228.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_228.coordinates_.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            operator_delete(local_1b8,local_1a0 * 0x18);
                                            operator_delete(_Var3._M_current,8);
                                            _Var3._M_current = (unsigned_long *)operator_new(8);
                                            *_Var3._M_current = 0x18;
                                            local_1c8._0_8_ = this;
                                            andres::marray_detail::
                                            Geometry<std::allocator<unsigned_long>>::
                                            Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                      ((Geometry<std::allocator<unsigned_long>> *)
                                                       (local_1c8 + 8),_Var3,
                                                       (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                            andres::View<int,_true,_std::allocator<unsigned_long>_>
                                            ::testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                            local_228.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish =
                                                 (pointer)0x0;
                                            local_228.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 (pointer)0x0;
                                            local_228.index_ = 0;
                                            local_228.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0
                                            ;
                                            local_228.view_ = (view_pointer)0x0;
                                            local_228.pointer_ = (pointer)0x0;
                                            andres::
                                            Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                            testInvariant(&local_228);
                                            andres::View<int,_true,_std::allocator<unsigned_long>_>
                                            ::testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                            andres::
                                            Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                            Iterator(&local_1f8,
                                                     (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8,0);
                                            puVar2 = local_228.coordinates_.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            ;
                                            puVar1 = local_228.coordinates_.
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                            local_228.view_ = local_1f8.view_;
                                            local_228.pointer_ = local_1f8.pointer_;
                                            local_228.index_ = local_1f8.index_;
                                            local_228.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start =
                                                 local_1f8.coordinates_.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start;
                                            local_228.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish =
                                                 local_1f8.coordinates_.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish;
                                            local_228.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 local_1f8.coordinates_.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                            local_1f8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0
                                            ;
                                            local_1f8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish =
                                                 (pointer)0x0;
                                            local_1f8.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 (pointer)0x0;
                                            if (puVar1 != (pointer)0x0) {
                                              operator_delete(puVar1,(long)puVar2 - (long)puVar1);
                                            }
                                            if (local_1f8.coordinates_.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_1f8.coordinates_.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            lVar11 = 0;
                                            do {
                                              if ((local_228.view_ == (view_pointer)0x0) ||
                                                 (((local_228.view_)->geometry_).size_ <=
                                                  local_228.index_)) {
                                                plVar6 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::runtime_error::runtime_error
                                                          ((runtime_error *)plVar6,
                                                           "Assertion failed.");
                                                pcVar7 = std::runtime_error::~runtime_error;
                                                puVar10 = &std::runtime_error::typeinfo;
LAB_001c5975:
                                                __cxa_throw(plVar6,puVar10,pcVar7);
                                              }
                                              if (*local_228.pointer_ != this->data_[lVar11]) {
                                                plVar6 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::logic_error::logic_error(plVar6,"test failed.")
                                                ;
                                                pcVar7 = std::logic_error::~logic_error;
                                                puVar10 = &std::logic_error::typeinfo;
                                                goto LAB_001c5975;
                                              }
                                              andres::
                                              Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                              operator++(&local_228);
                                              lVar11 = lVar11 + 1;
                                            } while (lVar11 != 0x18);
                                            andres::View<int,_true,_std::allocator<unsigned_long>_>
                                            ::testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                            andres::
                                            Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                            Iterator(&local_1f8,
                                                     (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8,local_198);
                                            if (local_228.view_ == (view_pointer)0x0) {
                                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::runtime_error::runtime_error
                                                        ((runtime_error *)plVar6,"Assertion failed."
                                                        );
                                            }
                                            else {
                                              if (local_1f8.view_ == local_228.view_) {
                                                if (local_228.index_ == local_1f8.index_) {
                                                  if (local_1f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar4 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_228);
                                                  if ((pIVar4->view_ == (view_pointer)0x0) ||
                                                     ((pIVar4->view_->geometry_).size_ <=
                                                      pIVar4->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c64bd:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  if (*pIVar4->pointer_ != 0x2e) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c64bd;
                                                  }
                                                  if (local_228.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_228);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_188,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,0);
                                                  local_1f8.view_ = (view_pointer)local_188.view_;
                                                  local_1f8.pointer_ = local_188.pointer_;
                                                  local_1f8.index_ = local_188.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_1f8.coordinates_,
                                                           &local_188.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1f8);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_1f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_188.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_188.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar11 = 0;
                                                  do {
                                                    if ((local_228.view_ == (view_pointer)0x0) ||
                                                       (((local_228.view_)->geometry_).size_ <=
                                                        local_228.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar10 = &std::runtime_error::typeinfo;
LAB_001c59a7:
                                                      __cxa_throw(plVar6,puVar10,pcVar7);
                                                    }
                                                    if (*local_228.pointer_ != this->data_[lVar11])
                                                    {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar10 = &std::logic_error::typeinfo;
                                                      goto LAB_001c59a7;
                                                    }
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_228);
                                                  lVar11 = lVar11 + 1;
                                                  } while (lVar11 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_1c8,local_198);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ == local_1f8.index_) {
                                                        if (local_1f8.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar4 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_228);
                                                  if ((pIVar4->view_ == (view_pointer)0x0) ||
                                                     ((pIVar4->view_->geometry_).size_ <=
                                                      pIVar4->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c656b:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  if (*pIVar4->pointer_ != 0x2e) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c656b;
                                                  }
                                                  if (local_228.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_228);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8,local_198);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_1f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  uVar9 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_228);
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c59d9:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  iVar8 = (int)uVar9;
                                                  if (*local_228.pointer_ != this->data_[uVar9]) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c59d9;
                                                  }
                                                  uVar9 = (ulong)(iVar8 - 1);
                                                  } while (iVar8 != 0);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8,0);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ == local_1f8.index_) {
                                                        if (local_1f8.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c6619:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  if (*local_228.pointer_ != 0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c6619;
                                                  }
                                                  if (local_228.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_228);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8,local_198);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_1f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  uVar9 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_228);
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c5a0b:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  iVar8 = (int)uVar9;
                                                  if (*local_228.pointer_ != this->data_[uVar9]) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c5a0b;
                                                  }
                                                  uVar9 = (ulong)(iVar8 - 1);
                                                  } while (iVar8 != 0);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8,0);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ == local_1f8.index_) {
                                                        if (local_1f8.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c66c7:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  if (*local_228.pointer_ != 0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c66c7;
                                                  }
                                                  if (local_228.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_228);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_188,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,local_198);
                                                  local_1f8.view_ = (view_pointer)local_188.view_;
                                                  local_1f8.pointer_ = local_188.pointer_;
                                                  local_1f8.index_ = local_188.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_1f8.coordinates_,
                                                           &local_188.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1f8);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_1f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_188.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_188.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  uVar9 = 0x17;
                                                  do {
                                                    andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_228);
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c5a3d:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  iVar8 = (int)uVar9;
                                                  if (*local_228.pointer_ != this->data_[uVar9]) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c5a3d;
                                                  }
                                                  uVar9 = (ulong)(iVar8 - 1);
                                                  } while (iVar8 != 0);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_1c8,0);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ == local_1f8.index_) {
                                                        if (local_1f8.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c6775:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  if (*local_228.pointer_ != 0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c6775;
                                                  }
                                                  if (local_228.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_228);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8,0);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_1f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar11 = 0;
                                                  do {
                                                    if ((local_228.view_ == (view_pointer)0x0) ||
                                                       (((local_228.view_)->geometry_).size_ <=
                                                        local_228.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar10 = &std::runtime_error::typeinfo;
LAB_001c5a6f:
                                                      __cxa_throw(plVar6,puVar10,pcVar7);
                                                    }
                                                    if (*local_228.pointer_ != this->data_[lVar11])
                                                    {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar10 = &std::logic_error::typeinfo;
                                                      goto LAB_001c5a6f;
                                                    }
                                                    local_58 = local_228.index_;
                                                    local_68 = local_228.view_;
                                                    piStack_60 = local_228.pointer_;
                                                    std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_50,&local_228.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_228);
                                                  if (local_50.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_50.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_50.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_50.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar11 = lVar11 + 1;
                                                  } while (lVar11 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8,local_198);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ == local_1f8.index_) {
                                                        if (local_1f8.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar4 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_228);
                                                  if ((pIVar4->view_ == (view_pointer)0x0) ||
                                                     ((pIVar4->view_->geometry_).size_ <=
                                                      pIVar4->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c6823:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  if (*pIVar4->pointer_ != 0x2e) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c6823;
                                                  }
                                                  if (local_228.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_228);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8,0);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_1f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar11 = 0;
                                                  do {
                                                    if ((local_228.view_ == (view_pointer)0x0) ||
                                                       (((local_228.view_)->geometry_).size_ <=
                                                        local_228.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar10 = &std::runtime_error::typeinfo;
LAB_001c5aa1:
                                                      __cxa_throw(plVar6,puVar10,pcVar7);
                                                    }
                                                    if (*local_228.pointer_ != this->data_[lVar11])
                                                    {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar10 = &std::logic_error::typeinfo;
                                                      goto LAB_001c5aa1;
                                                    }
                                                    local_88 = local_228.index_;
                                                    local_98 = local_228.view_;
                                                    piStack_90 = local_228.pointer_;
                                                    std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_80,&local_228.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_228);
                                                  if (local_80.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_80.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_80.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_80.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar11 = lVar11 + 1;
                                                  } while (lVar11 != 0x18);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8,local_198);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ == local_1f8.index_) {
                                                        if (local_1f8.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar4 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_228);
                                                  if ((pIVar4->view_ == (view_pointer)0x0) ||
                                                     ((pIVar4->view_->geometry_).size_ <=
                                                      pIVar4->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c68d1:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  if (*pIVar4->pointer_ != 0x2e) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c68d1;
                                                  }
                                                  if (local_228.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_228);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_188,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,0);
                                                  local_1f8.view_ = (view_pointer)local_188.view_;
                                                  local_1f8.pointer_ = local_188.pointer_;
                                                  local_1f8.index_ = local_188.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_1f8.coordinates_,
                                                           &local_188.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1f8);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_1f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_188.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_188.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar11 = 0;
                                                  do {
                                                    if ((local_228.view_ == (view_pointer)0x0) ||
                                                       (((local_228.view_)->geometry_).size_ <=
                                                        local_228.index_)) {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar6,
                                                                 "Assertion failed.");
                                                      pcVar7 = std::runtime_error::~runtime_error;
                                                      puVar10 = &std::runtime_error::typeinfo;
LAB_001c5ad3:
                                                      __cxa_throw(plVar6,puVar10,pcVar7);
                                                    }
                                                    if (*local_228.pointer_ != this->data_[lVar11])
                                                    {
                                                      plVar6 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::logic_error::logic_error
                                                                (plVar6,"test failed.");
                                                      pcVar7 = std::logic_error::~logic_error;
                                                      puVar10 = &std::logic_error::typeinfo;
                                                      goto LAB_001c5ad3;
                                                    }
                                                    local_b8 = local_228.index_;
                                                    local_c8 = local_228.view_;
                                                    piStack_c0 = local_228.pointer_;
                                                    std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_b0,&local_228.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator++(&local_228);
                                                  if (local_b0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_b0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_b0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_b0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  lVar11 = lVar11 + 1;
                                                  } while (lVar11 != 0x18);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_1c8,local_198);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ == local_1f8.index_) {
                                                        if (local_1f8.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  pIVar4 = andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_228);
                                                  if ((pIVar4->view_ == (view_pointer)0x0) ||
                                                     ((pIVar4->view_->geometry_).size_ <=
                                                      pIVar4->index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c697f:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  if (*pIVar4->pointer_ != 0x2e) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c697f;
                                                  }
                                                  if (local_228.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_228);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8,local_198);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_1f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  uVar9 = 0x17;
                                                  do {
                                                    if ((local_228.view_ == (view_pointer)0x0) ||
                                                       (local_228.index_ == 0)) {
                                                      prVar5 = (runtime_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                (prVar5,"Assertion failed.");
                                                      __cxa_throw(prVar5,&std::runtime_error::
                                                                          typeinfo,
                                                                  std::runtime_error::~runtime_error
                                                                 );
                                                    }
                                                    local_e8 = local_228.index_;
                                                    local_f8 = local_228.view_;
                                                    piStack_f0 = local_228.pointer_;
                                                    std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_e0,&local_228.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_228);
                                                  if (local_e0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_e0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_e0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_e0.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c5b05:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  iVar8 = (int)uVar9;
                                                  if (*local_228.pointer_ != this->data_[uVar9]) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c5b05;
                                                  }
                                                  uVar9 = (ulong)(iVar8 - 1);
                                                  } while (iVar8 != 0);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8,0);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ == local_1f8.index_) {
                                                        if (local_1f8.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c6a2d:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  if (*local_228.pointer_ != 0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c6a2d;
                                                  }
                                                  if (local_228.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_228);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8,local_198);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_1f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  uVar9 = 0x17;
                                                  do {
                                                    if ((local_228.view_ == (view_pointer)0x0) ||
                                                       (local_228.index_ == 0)) {
                                                      prVar5 = (runtime_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                (prVar5,"Assertion failed.");
                                                      __cxa_throw(prVar5,&std::runtime_error::
                                                                          typeinfo,
                                                                  std::runtime_error::~runtime_error
                                                                 );
                                                    }
                                                    local_118 = local_228.index_;
                                                    local_128 = local_228.view_;
                                                    piStack_120 = local_228.pointer_;
                                                    std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_110,&local_228.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_228);
                                                  if (local_110.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_110.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_110.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_110.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c5b69:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  iVar8 = (int)uVar9;
                                                  if (*local_228.pointer_ != this->data_[uVar9]) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c5b69;
                                                  }
                                                  uVar9 = (ulong)(iVar8 - 1);
                                                  } while (iVar8 != 0);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_1f8,
                                                             (
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_1c8,0);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ == local_1f8.index_) {
                                                        if (local_1f8.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c6adb:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  if (*local_228.pointer_ != 0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c6adb;
                                                  }
                                                  if (local_228.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  _Var3._M_current =
                                                       (unsigned_long *)operator_new(8);
                                                  *_Var3._M_current = 0x18;
                                                  local_1c8._0_8_ = this;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_1c8 + 8),_Var3,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_228
                                                  );
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  local_228.index_ = 0;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_228.view_ = (view_pointer)0x0;
                                                  local_228.pointer_ = (pointer)0x0;
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_228);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator(&local_188,
                                                             (
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8,local_198);
                                                  local_1f8.view_ = (view_pointer)local_188.view_;
                                                  local_1f8.pointer_ = local_188.pointer_;
                                                  local_1f8.index_ = local_188.index_;
                                                  std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_1f8.coordinates_,
                                                           &local_188.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::testInvariant(&local_1f8);
                                                  puVar2 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  puVar1 = local_228.coordinates_.
                                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.view_ = local_1f8.view_;
                                                  local_228.pointer_ = local_1f8.pointer_;
                                                  local_228.index_ = local_1f8.index_;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       local_1f8.coordinates_.
                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                                  local_228.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = local_1f8.coordinates_.
                                                                                                                  
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x0;
                                                  local_1f8.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x0;
                                                  if (puVar1 != (pointer)0x0) {
                                                    operator_delete(puVar1,(long)puVar2 -
                                                                           (long)puVar1);
                                                  }
                                                  if (local_1f8.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (local_188.coordinates_.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_188.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_188.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_188.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  uVar9 = 0x17;
                                                  do {
                                                    if ((local_228.view_ == (view_pointer)0x0) ||
                                                       (local_228.index_ == 0)) {
                                                      prVar5 = (runtime_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                (prVar5,"Assertion failed.");
                                                      __cxa_throw(prVar5,&std::runtime_error::
                                                                          typeinfo,
                                                                  std::runtime_error::~runtime_error
                                                                 );
                                                    }
                                                    local_148 = local_228.index_;
                                                    local_158 = local_228.view_;
                                                    piStack_150 = local_228.pointer_;
                                                    std::
                                                  vector<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ::vector(&local_140,&local_228.coordinates_);
                                                  andres::
                                                  Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  ::operator--(&local_228);
                                                  if (local_140.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_140.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_140.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_140.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c5bcd:
                                                    __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  iVar8 = (int)uVar9;
                                                  if (*local_228.pointer_ != this->data_[uVar9]) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar6,"test failed.");
                                                    pcVar7 = std::logic_error::~logic_error;
                                                    puVar10 = &std::logic_error::typeinfo;
                                                    goto LAB_001c5bcd;
                                                  }
                                                  uVar9 = (ulong)(iVar8 - 1);
                                                  } while (iVar8 != 0);
                                                  andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_1c8);
                                                  andres::
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  ::Iterator((
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  *)&local_1f8,
                                                  (View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_1c8,0);
                                                  if (local_228.view_ == (view_pointer)0x0) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                  }
                                                  else {
                                                    if (local_1f8.view_ == local_228.view_) {
                                                      if (local_228.index_ == local_1f8.index_) {
                                                        if (local_1f8.coordinates_.
                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_1f8.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_1f8.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_1f8.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if ((local_228.view_ == (view_pointer)0x0) ||
                                                     (((local_228.view_)->geometry_).size_ <=
                                                      local_228.index_)) {
                                                    plVar6 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar6,
                                                               "Assertion failed.");
                                                    pcVar7 = std::runtime_error::~runtime_error;
                                                    puVar10 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
                                                    if (*local_228.pointer_ == 0) {
                                                      if (local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(local_228.coordinates_.
                                                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_228.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_228.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  operator_delete(local_1b8,local_1a0 * 0x18);
                                                  operator_delete(_Var3._M_current,8);
                                                  return;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar10 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar10 = &std::logic_error::typeinfo;
                                                  goto LAB_001c6b57;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c6b57:
                                                  __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar10 = &std::logic_error::typeinfo;
                                                  goto LAB_001c6aa9;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c6aa9:
                                                  __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar10 = &std::logic_error::typeinfo;
                                                  goto LAB_001c69fb;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c69fb:
                                                  __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar10 = &std::logic_error::typeinfo;
                                                  goto LAB_001c694d;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c694d:
                                                  __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar10 = &std::logic_error::typeinfo;
                                                  goto LAB_001c689f;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c689f:
                                                  __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar10 = &std::logic_error::typeinfo;
                                                  goto LAB_001c67f1;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c67f1:
                                                  __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar10 = &std::logic_error::typeinfo;
                                                  goto LAB_001c6743;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c6743:
                                                  __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar10 = &std::logic_error::typeinfo;
                                                  goto LAB_001c6695;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c6695:
                                                  __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar10 = &std::logic_error::typeinfo;
                                                  goto LAB_001c65e7;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c65e7:
                                                  __cxa_throw(plVar6,puVar10,pcVar7);
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar7 = std::logic_error::~logic_error;
                                                  puVar10 = &std::logic_error::typeinfo;
                                                  goto LAB_001c6539;
                                                  }
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  }
                                                  pcVar7 = std::runtime_error::~runtime_error;
                                                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c6539:
                                                  __cxa_throw(plVar6,puVar10,pcVar7);
                                                }
                                                plVar6 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::logic_error::logic_error(plVar6,"test failed.")
                                                ;
                                                pcVar7 = std::logic_error::~logic_error;
                                                puVar10 = &std::logic_error::typeinfo;
                                                goto LAB_001c648b;
                                              }
                                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::runtime_error::runtime_error
                                                        ((runtime_error *)plVar6,"Assertion failed."
                                                        );
                                            }
                                            pcVar7 = std::runtime_error::~runtime_error;
                                            puVar10 = &std::runtime_error::typeinfo;
LAB_001c648b:
                                            __cxa_throw(plVar6,puVar10,pcVar7);
                                          }
                                          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::logic_error::logic_error(plVar6,"test failed.");
                                          pcVar7 = std::logic_error::~logic_error;
                                          puVar10 = &std::logic_error::typeinfo;
                                          goto LAB_001c63dd;
                                        }
                                        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                        std::runtime_error::runtime_error
                                                  ((runtime_error *)plVar6,"Assertion failed.");
                                      }
                                      pcVar7 = std::runtime_error::~runtime_error;
                                      puVar10 = &std::runtime_error::typeinfo;
LAB_001c63dd:
                                      __cxa_throw(plVar6,puVar10,pcVar7);
                                    }
                                    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar6,"test failed.");
                                    pcVar7 = std::logic_error::~logic_error;
                                    puVar10 = &std::logic_error::typeinfo;
                                    goto LAB_001c632f;
                                  }
                                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar6,"Assertion failed.");
                                }
                                pcVar7 = std::runtime_error::~runtime_error;
                                puVar10 = &std::runtime_error::typeinfo;
LAB_001c632f:
                                __cxa_throw(plVar6,puVar10,pcVar7);
                              }
                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar6,"test failed.");
                              pcVar7 = std::logic_error::~logic_error;
                              puVar10 = &std::logic_error::typeinfo;
                              goto LAB_001c6281;
                            }
                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar6,"Assertion failed.");
                          }
                          pcVar7 = std::runtime_error::~runtime_error;
                          puVar10 = &std::runtime_error::typeinfo;
LAB_001c6281:
                          __cxa_throw(plVar6,puVar10,pcVar7);
                        }
                        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar6,"test failed.");
                        pcVar7 = std::logic_error::~logic_error;
                        puVar10 = &std::logic_error::typeinfo;
                        goto LAB_001c61d3;
                      }
                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.")
                      ;
                    }
                    pcVar7 = std::runtime_error::~runtime_error;
                    puVar10 = &std::runtime_error::typeinfo;
LAB_001c61d3:
                    __cxa_throw(plVar6,puVar10,pcVar7);
                  }
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar6,"test failed.");
                  pcVar7 = std::logic_error::~logic_error;
                  puVar10 = &std::logic_error::typeinfo;
                  goto LAB_001c6125;
                }
                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
              }
              pcVar7 = std::runtime_error::~runtime_error;
              puVar10 = &std::runtime_error::typeinfo;
LAB_001c6125:
              __cxa_throw(plVar6,puVar10,pcVar7);
            }
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar6,"test failed.");
            pcVar7 = std::logic_error::~logic_error;
            puVar10 = &std::logic_error::typeinfo;
            goto LAB_001c6077;
          }
          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
        }
        pcVar7 = std::runtime_error::~runtime_error;
        puVar10 = &std::runtime_error::typeinfo;
LAB_001c6077:
        __cxa_throw(plVar6,puVar10,pcVar7);
      }
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar6,"test failed.");
      pcVar7 = std::logic_error::~logic_error;
      puVar10 = &std::logic_error::typeinfo;
      goto LAB_001c5fc9;
    }
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
  }
  pcVar7 = std::runtime_error::~runtime_error;
  puVar10 = &std::runtime_error::typeinfo;
LAB_001c5fc9:
  __cxa_throw(plVar6,puVar10,pcVar7);
}

Assistant:

void IteratorTest::arithmeticOperatorsTest(){
    // operator+=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it += 1;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it += 1;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it += 1;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator-=
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.end();

        
        for(int i = 23; i >= 0; --i){
            it -= 1;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it -= 1;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it -= 1;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    // operator++ prefix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator-- prefix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            --it;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            --it;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            --it;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    // operator++ postfix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it++;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it++;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            it++;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator-- postfix
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it--;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it--;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.end();
        
        for(int i = 23; i >= 0; --i){
            it--;
            test(*it == data_[i]);
        }
        test(it == v.begin());
        test(*it==0);
    }
}